

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPML_ALG_Unmarshal(TPML_ALG *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->count = UVar2;
    *buffer = *buffer + 4;
    TVar3 = 0x95;
    if (target->count < 0x41) {
      TVar3 = TPM_ALG_ID_Array_Unmarshal(target->algorithms,buffer,size,target->count);
      return TVar3;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPML_ALG_Unmarshal(TPML_ALG *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_ALG_LIST_SIZE)
        return TPM_RC_SIZE;
    result = TPM_ALG_ID_Array_Unmarshal((TPM_ALG_ID *)(target->algorithms), buffer, size, (INT32)(target->count));
    return result;
}